

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O0

Value __thiscall jbcoin::STPathSet::getJson(STPathSet *this,int options)

{
  bool bVar1;
  vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *this_00;
  reference pSVar2;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  Value VVar3;
  STPath local_70;
  undefined1 local_50 [8];
  STPath it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *__range1;
  int options_local;
  STPathSet *this_local;
  Value *ret;
  
  Json::Value::Value((Value *)this,arrayValue);
  this_00 = (vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)
            (CONCAT44(in_register_00000034,options) + 0x10);
  __end1 = std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::begin(this_00);
  it.mPath.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>
                                     *)&it.mPath.
                                        super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)
  {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>
             ::operator*(&__end1);
    STPath::STPath((STPath *)local_50,pSVar2);
    STPath::getJson(&local_70,(int)local_50);
    Json::Value::append((Value *)this,(Value *)&local_70);
    Json::Value::~Value((Value *)&local_70);
    STPath::~STPath((STPath *)local_50);
    __gnu_cxx::
    __normal_iterator<const_jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>
    ::operator++(&__end1);
  }
  VVar3._8_8_ = extraout_RDX;
  VVar3.value_.map_ = (ObjectValues *)this;
  return VVar3;
}

Assistant:

Json::Value
STPathSet::getJson (int options) const
{
    Json::Value ret (Json::arrayValue);
    for (auto it: value)
        ret.append (it.getJson (options));

    return ret;
}